

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O2

void __thiscall
Am_Inter_Location::Get_Location
          (Am_Inter_Location *this,bool *as_line,Am_Object *ref_obj,int *a,int *b,int *c,int *d)

{
  Am_Inter_Location_Data *pAVar1;
  
  pAVar1 = this->data;
  if (pAVar1 != (Am_Inter_Location_Data *)0x0) {
    *as_line = pAVar1->as_line;
    Am_Object::operator=(ref_obj,&pAVar1->ref_obj);
    pAVar1 = this->data;
    *a = (pAVar1->data).rect.left;
    *b = (pAVar1->data).rect.top;
    *c = (pAVar1->data).rect.width;
    *d = (pAVar1->data).rect.height;
    return;
  }
  Am_Error("Am_Inter_Location not initialized");
}

Assistant:

void
Am_Inter_Location::Get_Location(bool &as_line, Am_Object &ref_obj, int &a,
                                int &b, int &c, int &d) const
{
  if (!data)
    Am_Error("Am_Inter_Location not initialized");
  as_line = data->as_line;
  ref_obj = data->ref_obj;
  a = data->data.line.x1;
  b = data->data.line.y1;
  c = data->data.line.x2;
  d = data->data.line.y2;
}